

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionEuler.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms
          (ChBeamSectionEulerAdvancedGeneric *this,ChVector<double> *mF,ChVector<double> *mT,
          ChVector<double> *mW)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  dVar1 = mW->m_data[2];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar1;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this->Mz;
  dVar4 = mW->m_data[0];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar4;
  dVar2 = mW->m_data[1];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar2;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = this->Mz * dVar4;
  auVar8 = vfmsub231sd_fma(auVar18,auVar5,ZEXT816(0) << 0x40);
  dVar3 = this->mu;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = this->My;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = this->My * dVar1;
  auVar9 = vfmsub231sd_fma(auVar21,auVar16,auVar9);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = auVar9._0_8_ * dVar2;
  auVar10 = vfmsub231sd_fma(auVar10,auVar13,auVar8);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar2 * -0.0;
  auVar7 = vfmadd231sd_fma(auVar22,auVar13,auVar20);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = auVar7._0_8_ * dVar4;
  auVar9 = vfmsub231sd_fma(auVar14,auVar5,auVar9);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = auVar8._0_8_ * dVar1;
  auVar7 = vfmsub231sd_fma(auVar6,auVar16,auVar7);
  dVar4 = dVar3 * auVar7._0_8_;
  mF->m_data[0] = dVar4;
  mF->m_data[1] = dVar3 * auVar9._0_8_;
  mF->m_data[2] = dVar3 * auVar10._0_8_;
  (*(this->super_ChBeamSectionEuler).super_ChBeamSection._vptr_ChBeamSection[0xc])();
  dVar1 = mW->m_data[0];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar1;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = mW->m_data[1];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar4 * dVar1 * mW->m_data[1];
  auVar9 = vfmsub231sd_fma(auVar17,auVar11,ZEXT816(0) << 0x40);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = mW->m_data[2];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar4 * dVar1;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar1 * -0.0;
  auVar7 = vfmadd231sd_fma(auVar12,auVar19,auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = mW->m_data[2] * -0.0;
  auVar8 = vfmadd231sd_fma(auVar8,auVar15,ZEXT816(0) << 0x40);
  mT->m_data[0] = auVar8._0_8_;
  mT->m_data[1] = auVar7._0_8_;
  mT->m_data[2] = auVar9._0_8_;
  return;
}

Assistant:

void ChBeamSectionEulerAdvancedGeneric::ComputeQuadraticTerms(ChVector<>& mF,   ///< centrifugal term (if any) returned here
		ChVector<>& mT,                ///< gyroscopic term  returned here
		const ChVector<>& mW           ///< current angular velocity of section, in material frame
	) {
		// F_centrifugal = density_per_unit_length w X w X c 
		mF = this->mu * Vcross(mW,Vcross(mW,ChVector<>(0,My,Mz)));

		// unroll the product [J] * w  in the expression w X [J] * w  as 8 values of [J] are zero anyway
		mT = Vcross(mW, ChVector<>( this->GetInertiaJxxPerUnitLength()*mW.x(),
									0,
									0 )  );
	}